

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_set_unknown_chunks(spng_ctx *ctx,spng_unknown_chunk *chunks,uint32_t n_chunks)

{
  undefined1 *puVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  if (n_chunks == 0) {
    return 1;
  }
  if (chunks == (spng_unknown_chunk *)0x0 || ctx == (spng_ctx *)0x0) {
LAB_0010a1d1:
    iVar2 = 1;
  }
  else if (((ctx->data != (uchar *)0x0) || (iVar2 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
          (iVar2 = read_chunks(ctx,0), iVar2 == 0)) {
    lVar3 = 0;
    do {
      if (0x7fffffff < *(ulong *)(chunks->type + lVar3 + 8)) {
        return 0x4f;
      }
      if ((*(ulong *)(chunks->type + lVar3 + 8) != 0) &&
         (*(long *)(chunks->type + lVar3 + 0x10) == 0)) goto LAB_0010a1d1;
      if (8 < *(uint *)(chunks->type + lVar3 + 0x18)) {
        return 0x10;
      }
      if ((0x106U >> (*(uint *)(chunks->type + lVar3 + 0x18) & 0x1f) & 1) == 0) {
        return 0x10;
      }
      lVar3 = lVar3 + 0x20;
    } while ((ulong)(n_chunks + (n_chunks == 0)) << 5 != lVar3);
    if ((((ctx->stored).field_0x2 & 1) != 0) && (((ctx->user).field_0x2 & 1) == 0)) {
      if (ctx->n_chunks != 0) {
        lVar3 = 0x10;
        uVar4 = 0;
        do {
          (*(ctx->alloc).free_fn)(*(void **)(ctx->chunk_list->type + lVar3));
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + 0x20;
        } while (uVar4 < ctx->n_chunks);
      }
      (*(ctx->alloc).free_fn)(ctx->chunk_list);
    }
    ctx->chunk_list = chunks;
    ctx->n_chunks = n_chunks;
    puVar1 = &(ctx->stored).field_0x2;
    *puVar1 = *puVar1 | 1;
    puVar1 = &(ctx->user).field_0x2;
    *puVar1 = *puVar1 | 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int spng_set_unknown_chunks(spng_ctx *ctx, struct spng_unknown_chunk *chunks, uint32_t n_chunks)
{
    if(!n_chunks) return 1;
    SPNG_SET_CHUNK_BOILERPLATE(chunks);

    uint32_t i;
    for(i=0; i < n_chunks; i++)
    {
        if(chunks[i].length > spng_u32max) return SPNG_ECHUNK_STDLEN;
        if(chunks[i].length && chunks[i].data == NULL) return 1;

        switch(chunks[i].location)
        {
            case SPNG_AFTER_IHDR:
            case SPNG_AFTER_PLTE:
            case SPNG_AFTER_IDAT:
            break;
            default: return SPNG_ECHUNK_POS;
        }
    }

    if(ctx->stored.unknown && !ctx->user.unknown)
    {
        for(i=0; i < ctx->n_chunks; i++)
        {
            spng__free(ctx, ctx->chunk_list[i].data);
        }
        spng__free(ctx, ctx->chunk_list);
    }

    ctx->chunk_list = chunks;
    ctx->n_chunks = n_chunks;

    ctx->stored.unknown = 1;
    ctx->user.unknown = 1;

    return 0;
}